

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCount.hpp
# Opt level: O3

RefCount<antlr::LexerInputState> * __thiscall
antlr::RefCount<antlr::LexerInputState>::operator=
          (RefCount<antlr::LexerInputState> *this,RefCount<antlr::LexerInputState> *other)

{
  uint *puVar1;
  Ref *pRVar2;
  Ref *pRVar3;
  
  pRVar2 = other->ref;
  if (pRVar2 != (Ref *)0x0) {
    pRVar2->count = pRVar2->count + 1;
  }
  pRVar3 = this->ref;
  if (pRVar3 != (Ref *)0x0) {
    puVar1 = &pRVar3->count;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      if (pRVar3->ptr != (LexerInputState *)0x0) {
        (*pRVar3->ptr->_vptr_LexerInputState[3])();
      }
      operator_delete(pRVar3,0x10);
    }
  }
  this->ref = pRVar2;
  return this;
}

Assistant:

RefCount<T>& operator=(const RefCount<T>& other)
	{
		Ref* tmp = other.ref ? other.ref->increment() : 0;
		if (ref && ref->decrement())
			delete ref;
		ref = tmp;
		return *this;
	}